

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Read.cpp
# Opt level: O2

expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> *
idx2::ReadChunkExponents
          (expected<const_idx2::chunk_exp_cache_*,_idx2::idx2_err_code> *__return_storage_ptr__,
          idx2_file *Idx2,decode_data *D,u64 Brick,i8 Level,i8 Subband)

{
  byte *pbVar1;
  decode_data *pdVar2;
  i64 iVar3;
  bool bVar4;
  __off_t _Var5;
  __off_t _Var6;
  byte bVar7;
  unsigned_long *Key;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  FILE *pFVar15;
  FILE *pFVar16;
  undefined7 in_register_00000081;
  chunk_exp_cache *Val;
  undefined7 in_register_00000089;
  ulong uVar17;
  ulong uVar18;
  undefined4 uVar19;
  size_t sVar20;
  long *in_FS_OFFSET;
  stref sVar21;
  int NChunks;
  FILE *Fp;
  FILE *local_2b8;
  decode_data *local_2b0;
  undefined4 local_2a4;
  int S;
  int ExponentSize;
  timer IOTimer_1;
  FILE *local_280;
  ulong local_278;
  uint local_270;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:409:5)>
  __ScopeGuard__409;
  file_id FileId;
  iterator FileCacheIt;
  FILE *Fp_1;
  long lStack_200;
  mallocator *local_1f8;
  u64 local_1f0;
  u64 ChunkAddr;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:291:3)>
  __ScopeGuard__291;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:285:3)>
  __ScopeGuard__285;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:282:3)>
  __ScopeGuard__282;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:269:3)>
  __ScopeGuard__269;
  int ChunkAddrsSz;
  timer IOTimer;
  u64 ChunkAddress;
  chunk_exp_cache *pcStack_180;
  mallocator *local_178;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Read_cpp:395:5)>
  __ScopeGuard__395;
  file_cache FileCache;
  chunk_exp_cache ChunkExpCache;
  
  local_2b8 = (FILE *)CONCAT44(local_2b8._4_4_,(int)CONCAT71(in_register_00000081,Level));
  Key = (unsigned_long *)(CONCAT71(in_register_00000081,Level) & 0xffffffff);
  local_2a4 = (undefined4)CONCAT71(in_register_00000089,Subband);
  ConstructFilePath(&FileId,Idx2,Brick,(i8)Key,Subband,0);
  local_2b0 = D;
  Lookup<unsigned_long,idx2::file_cache>
            (&FileCacheIt,(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)&FileId.Id,Key);
  clock_gettime(1,(timespec *)&IOTimer);
  local_1f0 = Brick;
  if (((FileCacheIt.Ht)->Stats[FileCacheIt.Idx] == Occupied) &&
     ((FileCacheIt.Val)->ExpCached == true)) {
    *(char **)(*in_FS_OFFSET + -0xe80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x10b;
    pcVar11 = "";
    uVar19 = 0;
  }
  else {
    Fp = (FILE *)fopen(FileId.Name.field_0.Ptr,"rb");
    __ScopeGuard__269.Func.Fp = &Fp;
    __ScopeGuard__269.Dismissed = false;
    if ((FILE *)Fp == (FILE *)0x0) {
      *(char **)(*in_FS_OFFSET + -0xe80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x10e;
      sVar21 = ToString(FileNotFound);
      lVar14 = *in_FS_OFFSET;
      iVar13 = snprintf((char *)(lVar14 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                        (ulong)(uint)sVar21.Size,sVar21.field_0.Ptr,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                        ,0x10e);
      pcVar11 = "File: %s";
      snprintf((char *)(lVar14 + -0xc80) + iVar13,0x400 - (long)iVar13,"File: %s",
               FileId.Name.field_0.Ptr);
      uVar19 = 0x10025;
    }
    else {
      fseeko((FILE *)Fp,0,2);
      _Var5 = ftello((FILE *)Fp);
      pFVar16 = Fp;
      ExponentSize = 0;
      _Var6 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar16,_Var6 + -4,0);
      fread(&ExponentSize,4,1,(FILE *)pFVar16);
      fseeko((FILE *)pFVar16,_Var6 + -4,0);
      pFVar16 = Fp;
      NChunks = 0;
      _Var6 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar16,_Var6 + -4,0);
      fread(&NChunks,4,1,(FILE *)pFVar16);
      fseeko((FILE *)pFVar16,_Var6 + -4,0);
      pFVar16 = Fp;
      _Var6 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar16,_Var6 + -4,0);
      fread(&ChunkAddrsSz,4,1,(FILE *)pFVar16);
      fseeko((FILE *)pFVar16,_Var6 + -4,0);
      Mallocator();
      __ScopeGuard__409.Func.CompressedChunkExpsBuf = (buffer *)0x0;
      __ScopeGuard__409.Dismissed = false;
      __ScopeGuard__409._9_7_ = 0;
      __ScopeGuard__282.Dismissed = false;
      sVar20 = (size_t)ChunkAddrsSz;
      __ScopeGuard__282.Func.CpresChunkAddrs = (buffer *)&__ScopeGuard__409;
      Mallocator();
      AllocBuf((buffer *)&__ScopeGuard__409,sVar20,&Mallocator::Instance.super_allocator);
      pFVar16 = Fp;
      if ((long)__ScopeGuard__409._8_8_ < (long)sVar20) {
LAB_0016651d:
        __assert_fail("Sz <= Size(*Buf)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.h"
                      ,0x9d,"void idx2::ReadBackwardBuffer(FILE *, buffer *, i64)");
      }
      _Var6 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar16,_Var6 - sVar20,0);
      fread(__ScopeGuard__409.Func.CompressedChunkExpsBuf,sVar20,1,(FILE *)pFVar16);
      fseeko((FILE *)pFVar16,_Var6 - sVar20,0);
      LOCK();
      (local_2b0->BytesData_).super___atomic_base<unsigned_long>._M_i =
           (local_2b0->BytesData_).super___atomic_base<unsigned_long>._M_i + sVar20;
      UNLOCK();
      Mallocator();
      ChunkAddress = 0;
      pcStack_180 = (chunk_exp_cache *)0x0;
      local_178 = &Mallocator::Instance;
      __ScopeGuard__285.Dismissed = false;
      lVar14 = (long)NChunks;
      __ScopeGuard__285.Func.ChunkAddrsBuf = (buffer *)&ChunkAddress;
      Mallocator();
      AllocBuf((buffer *)&ChunkAddress,lVar14 << 3,&Mallocator::Instance.super_allocator);
      DecompressBufZstd((buffer *)&__ScopeGuard__409,(buffer *)&ChunkAddress);
      pFVar16 = Fp;
      S = 0;
      _Var6 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar16,_Var6 + -4,0);
      fread(&S,4,1,(FILE *)pFVar16);
      fseeko((FILE *)pFVar16,_Var6 + -4,0);
      Mallocator();
      Fp_1 = (FILE *)0x0;
      lStack_200 = 0;
      local_1f8 = &Mallocator::Instance;
      __ScopeGuard__291.Dismissed = false;
      sVar20 = (size_t)S;
      __ScopeGuard__291.Func.ChunkExpSizesBuf = (buffer *)&Fp_1;
      Mallocator();
      AllocBuf((buffer *)&Fp_1,sVar20,&Mallocator::Instance.super_allocator);
      pFVar16 = Fp;
      if (lStack_200 < (long)sVar20) goto LAB_0016651d;
      _Var6 = ftello((FILE *)Fp);
      fseeko((FILE *)pFVar16,_Var6 - sVar20,0);
      fread(Fp_1,sVar20,1,(FILE *)pFVar16);
      fseeko((FILE *)pFVar16,_Var6 - sVar20,0);
      pdVar2 = local_2b0;
      LOCK();
      (local_2b0->BytesExps_).super___atomic_base<unsigned_long>._M_i =
           (local_2b0->BytesExps_).super___atomic_base<unsigned_long>._M_i + sVar20 + 4;
      UNLOCK();
      clock_gettime(1,(timespec *)&FileCache);
      LOCK();
      (pdVar2->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
           (pdVar2->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
           (long)((double)((long)FileCache.ChunkOffsets.Buffer.Data - IOTimer.Start.tv_sec) *
                  1000000000.0 +
                 (double)(FileCache.ChunkOffsets.Buffer.Bytes - IOTimer.Start.tv_nsec));
      UNLOCK();
      bitstream::bitstream((bitstream *)&IOTimer_1);
      IOTimer_1.Start.tv_sec = (__time_t)Fp_1;
      IOTimer_1.Start.tv_nsec = lStack_200;
      local_280 = Fp_1;
      local_278 = *(ulong *)Fp_1;
      local_270 = 0;
      file_cache::file_cache(&FileCache);
      Mallocator();
      Init<unsigned_long,idx2::chunk_exp_cache>
                (&FileCache.ChunkExpCaches,10,&Mallocator::Instance.super_allocator);
      FileCache.ExponentBeginOffset = _Var5 - ExponentSize;
      lVar14 = (long)S;
      GrowCapacity<int>(&FileCache.ChunkExpOffsets,lVar14);
      uVar9 = 0;
      iVar13 = 0;
      while (iVar12 = (int)uVar9,
            (long)(local_280 + ((int)(local_270 + 7) / 8 - IOTimer_1.Start.tv_sec)) < lVar14) {
        bVar7 = 0;
        lVar10 = 0;
        pFVar16 = local_280;
        uVar17 = local_278;
        do {
          pFVar15 = pFVar16;
          if (0x39 < (int)local_270) {
            pFVar15 = pFVar16 + (local_270 >> 3);
            uVar17 = *(ulong *)(pFVar16 + (local_270 >> 3));
            local_270 = local_270 & 7;
            local_280 = pFVar15;
            local_278 = uVar17;
          }
          uVar18 = uVar17 >> ((byte)local_270 & 0x3f);
          uVar8 = local_270 + 7;
          pFVar16 = pFVar15;
          if (0x38 < (int)local_270) {
            pFVar16 = pFVar15 + (uVar8 >> 3);
            uVar17 = *(ulong *)(pFVar15 + (uVar8 >> 3));
            uVar8 = 0;
            local_280 = pFVar16;
            local_278 = uVar17;
          }
          lVar10 = lVar10 + ((uVar18 & bitstream::Masks.Arr[7]) << (bVar7 & 0x3f));
          local_270 = uVar8 + 1;
          bVar7 = bVar7 + 7;
        } while ((uVar17 >> ((byte)uVar8 & 0x3f) & bitstream::Masks.Arr[1]) != 0);
        Val = (chunk_exp_cache *)bitstream::Masks.Arr[1];
        if (FileCache.ChunkExpOffsets.Capacity <= FileCache.ChunkExpOffsets.Size) {
          GrowCapacity<int>(&FileCache.ChunkExpOffsets,0);
        }
        iVar13 = iVar13 + (int)lVar10;
        *(int *)(FileCache.ChunkExpOffsets.Buffer.Data + FileCache.ChunkExpOffsets.Size * 4) =
             iVar13;
        ChunkAddr = *(u64 *)(ChunkAddress + uVar9 * 8);
        FileCache.ChunkExpOffsets.Size = FileCache.ChunkExpOffsets.Size + 1;
        chunk_exp_cache::chunk_exp_cache(&ChunkExpCache);
        ChunkExpCache.ChunkPos = iVar12;
        Insert<unsigned_long,idx2::chunk_exp_cache>
                  ((iterator *)&__ScopeGuard__395,(idx2 *)&FileCache.ChunkExpCaches,
                   (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)&ChunkAddr,
                   (unsigned_long *)&ChunkExpCache,Val);
        uVar9 = uVar9 + 1;
      }
      if (NChunks == iVar12) {
        if ((long)iVar12 % (Idx2->Subbands).Size == 0) {
          if ((FileCacheIt.Ht)->Stats[FileCacheIt.Idx] == Occupied) {
            (FileCacheIt.Val)->ExponentBeginOffset = FileCache.ExponentBeginOffset;
            ((FileCacheIt.Val)->ChunkExpOffsets).Buffer.Data = FileCache.ChunkExpOffsets.Buffer.Data
            ;
            ((FileCacheIt.Val)->ChunkExpOffsets).Buffer.Bytes =
                 FileCache.ChunkExpOffsets.Buffer.Bytes;
            ((FileCacheIt.Val)->ChunkExpOffsets).Buffer.Alloc =
                 FileCache.ChunkExpOffsets.Buffer.Alloc;
            ((FileCacheIt.Val)->ChunkExpOffsets).Size = FileCache.ChunkExpOffsets.Size;
            ((FileCacheIt.Val)->ChunkExpOffsets).Buffer.Alloc =
                 FileCache.ChunkExpOffsets.Buffer.Alloc;
            ((FileCacheIt.Val)->ChunkExpOffsets).Size = FileCache.ChunkExpOffsets.Size;
            ((FileCacheIt.Val)->ChunkExpOffsets).Capacity = FileCache.ChunkExpOffsets.Capacity;
            ((FileCacheIt.Val)->ChunkExpOffsets).Alloc = FileCache.ChunkExpOffsets.Alloc;
            ((FileCacheIt.Val)->ChunkExpCaches).Keys = FileCache.ChunkExpCaches.Keys;
            ((FileCacheIt.Val)->ChunkExpCaches).Vals = FileCache.ChunkExpCaches.Vals;
            ((FileCacheIt.Val)->ChunkExpCaches).Stats = FileCache.ChunkExpCaches.Stats;
            ((FileCacheIt.Val)->ChunkExpCaches).Size = FileCache.ChunkExpCaches.Size;
            ((FileCacheIt.Val)->ChunkExpCaches).Stats = FileCache.ChunkExpCaches.Stats;
            ((FileCacheIt.Val)->ChunkExpCaches).Size = FileCache.ChunkExpCaches.Size;
            ((FileCacheIt.Val)->ChunkExpCaches).LogCapacity = FileCache.ChunkExpCaches.LogCapacity;
            ((FileCacheIt.Val)->ChunkExpCaches).Alloc = FileCache.ChunkExpCaches.Alloc;
          }
          else {
            Insert<unsigned_long,idx2::file_cache>(&FileCacheIt,&FileId.Id,&FileCache);
          }
          (FileCacheIt.Val)->ExpCached = true;
          *(char **)(*in_FS_OFFSET + -0xe80) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
          ;
          *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x155;
          pcVar11 = "";
          uVar19 = 0;
        }
        else {
          *(char **)(*in_FS_OFFSET + -0xe80) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
          ;
          *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x143;
          sVar21 = ToString(SizeMismatched);
          lVar14 = *in_FS_OFFSET;
          iVar13 = snprintf((char *)(lVar14 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                            (ulong)(uint)sVar21.Size,sVar21.field_0.Ptr,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                            ,0x143);
          pcVar11 = "number of chunks = %d is not divisible by number of subbands which is %d\n";
          snprintf((char *)(lVar14 + -0xc80) + iVar13,0x400 - (long)iVar13,
                   "number of chunks = %d is not divisible by number of subbands which is %d\n",
                   (ulong)(uint)NChunks,(ulong)(uint)(Idx2->Subbands).Size);
          uVar19 = 0x10004;
        }
      }
      else {
        *(char **)(*in_FS_OFFSET + -0xe80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x13e;
        sVar21 = ToString(SizeMismatched);
        lVar14 = *in_FS_OFFSET;
        iVar13 = snprintf((char *)(lVar14 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                          (ulong)(uint)sVar21.Size,sVar21.field_0.Ptr,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                          ,0x13e);
        pcVar11 = "number of chunks is either %d or %d\n";
        snprintf((char *)(lVar14 + -0xc80) + iVar13,0x400 - (long)iVar13,
                 "number of chunks is either %d or %d\n",(ulong)(uint)NChunks,uVar9 & 0xffffffff);
        uVar19 = 0x10004;
      }
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:291:3)>
      ::~scope_guard(&__ScopeGuard__291);
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:285:3)>
      ::~scope_guard(&__ScopeGuard__285);
      scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:282:3)>
      ::~scope_guard(&__ScopeGuard__282);
    }
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:269:3)>
    ::~scope_guard(&__ScopeGuard__269);
  }
  if ((char)uVar19 == '\0') {
    if ((FileCacheIt.Ht)->Stats[FileCacheIt.Idx] == Occupied) {
      if ('\x0f' < (char)local_2b8) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
      }
      uVar9 = (ulong)(Idx2->BricksPerChunk).Arr[(char)local_2b8];
      lVar14 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar14 == 0; lVar14 = lVar14 + -1) {
        }
      }
      bVar7 = -(uVar9 == 0) | (byte)lVar14;
      ChunkAddress = (long)((int)(char)local_2a4 << 0xc) + ((ulong)((uint)local_2b8 & 0xff) << 0x3c)
                     + (local_1f0 >> ((1L << (bVar7 & 0x3f) != uVar9) + bVar7 & 0x3f)) * 0x40000;
      Lookup<unsigned_long,idx2::chunk_exp_cache>
                ((iterator *)&FileCache,(idx2 *)&(FileCacheIt.Val)->ChunkExpCaches,
                 (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)&ChunkAddress,
                 (unsigned_long *)ChunkAddress);
      iVar3 = FileCache.ChunkOffsets.Buffer.Bytes;
      if (*(char *)((long)FileCache.ChunkOffsets.Buffer.Alloc[2]._vptr_allocator +
                   FileCache.ChunkOffsets.Size) == '\x02') {
        if (*(long *)(FileCache.ChunkOffsets.Buffer.Bytes + 0x10) == 0) {
          clock_gettime(1,(timespec *)&IOTimer_1);
          local_2b8 = fopen(FileId.Name.field_0.Ptr,"rb");
          __ScopeGuard__395.Func.Fp = &Fp_1;
          __ScopeGuard__395.Dismissed = false;
          Fp_1 = (FILE *)local_2b8;
          if (local_2b8 == (FILE *)0x0) {
            *(char **)(*in_FS_OFFSET + -0xe80) =
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
            ;
            *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x18d;
            sVar21 = ToString(FileNotFound);
            lVar14 = *in_FS_OFFSET;
            iVar13 = snprintf((char *)(lVar14 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                              (ulong)(uint)sVar21.Size,sVar21.field_0.Ptr,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                              ,0x18d);
            snprintf((char *)(lVar14 + -0xc80) + iVar13,0x400 - (long)iVar13,"File: %s\n",
                     FileId.Name.field_0.Ptr);
            __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_00199c10;
            (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)"File: %s\n";
            (__return_storage_ptr__->field_1).Err.StrGened = true;
            *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 8) = 0x25;
            *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0xb) =
                 FileCache.ChunkOffsets.Buffer.Data._0_4_;
            *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0xf) =
                 FileCache.ChunkOffsets.Buffer.Data._4_1_;
            __return_storage_ptr__->Ok = false;
          }
          else {
            lVar10 = (long)*(int *)iVar3;
            pbVar1 = ((FileCacheIt.Val)->ChunkExpOffsets).Buffer.Data;
            lVar14 = (FileCacheIt.Val)->ExponentBeginOffset;
            iVar13 = *(int *)(pbVar1 + lVar10 * 4);
            if (0 < lVar10) {
              iVar12 = *(int *)(pbVar1 + lVar10 * 4 + -4);
              lVar14 = lVar14 + iVar12;
              iVar13 = iVar13 - iVar12;
            }
            fseeko(local_2b8,lVar14,0);
            Mallocator();
            FileCache.ChunkOffsets.Buffer.Data = (byte *)0x0;
            FileCache.ChunkOffsets.Buffer.Bytes = 0;
            FileCache.ChunkOffsets.Buffer.Alloc = &Mallocator::Instance.super_allocator;
            __ScopeGuard__409._8_8_ = __ScopeGuard__409._8_8_ & 0xffffffffffffff00;
            sVar20 = (size_t)iVar13;
            __ScopeGuard__409.Func.CompressedChunkExpsBuf = (buffer *)&FileCache;
            Mallocator();
            AllocBuf((buffer *)&FileCache,sVar20,&Mallocator::Instance.super_allocator);
            fread(FileCache.ChunkOffsets.Buffer.Data,sVar20,1,(FILE *)Fp_1);
            DecompressBufZstd((buffer *)&FileCache,(bitstream *)(iVar3 + 8));
            pdVar2 = local_2b0;
            LOCK();
            (local_2b0->BytesDecoded_).super___atomic_base<unsigned_long>._M_i =
                 (local_2b0->BytesDecoded_).super___atomic_base<unsigned_long>._M_i + sVar20;
            UNLOCK();
            LOCK();
            (local_2b0->BytesExps_).super___atomic_base<unsigned_long>._M_i =
                 (local_2b0->BytesExps_).super___atomic_base<unsigned_long>._M_i + sVar20;
            UNLOCK();
            clock_gettime(1,(timespec *)&ChunkExpCache);
            LOCK();
            (pdVar2->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
                 (pdVar2->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
                 (long)((double)(CONCAT44(ChunkExpCache._4_4_,ChunkExpCache.ChunkPos) -
                                IOTimer_1.Start.tv_sec) * 1000000000.0 +
                       (double)((long)ChunkExpCache.ChunkExpStream.Stream.Data -
                               IOTimer_1.Start.tv_nsec));
            UNLOCK();
            *(undefined8 *)(iVar3 + 0x28) = 0;
            *(undefined8 **)(iVar3 + 0x20) = *(undefined8 **)(iVar3 + 8);
            *(undefined8 *)(iVar3 + 0x28) = **(undefined8 **)(iVar3 + 8);
            *(undefined4 *)(iVar3 + 0x30) = 0;
            scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:409:5)>
            ::~scope_guard(&__ScopeGuard__409);
          }
          scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp:395:5)>
          ::~scope_guard(&__ScopeGuard__395);
          if (local_2b8 == (FILE *)0x0) {
            return __return_storage_ptr__;
          }
        }
        __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_00199c10;
        (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)iVar3;
        bVar4 = true;
      }
      else {
        *(char **)(*in_FS_OFFSET + -0xe80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x184;
        __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_00199c10;
        (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)0x1882b2;
        (__return_storage_ptr__->field_1).Err.StrGened = false;
        *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 8) = 0x23;
        bVar4 = false;
      }
      __return_storage_ptr__->Ok = bVar4;
      return __return_storage_ptr__;
    }
    *(char **)(*in_FS_OFFSET + -0xe80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x17c;
    sVar21 = ToString(FileNotFound);
    lVar14 = *in_FS_OFFSET;
    iVar13 = snprintf((char *)(lVar14 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                      (ulong)(uint)sVar21.Size,sVar21.field_0.Ptr,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
                      ,0x17c);
    snprintf((char *)(lVar14 + -0xc80) + iVar13,0x400 - (long)iVar13,"File: %s\n",
             FileId.Name.field_0.Ptr);
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_00199c10;
    (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)"File: %s\n";
    (__return_storage_ptr__->field_1).Err.StrGened = true;
    *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 8) = 0x25;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0xb) =
         FileCache.ChunkOffsets.Buffer.Data._0_4_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0xf) =
         FileCache.ChunkOffsets.Buffer.Data._4_1_;
  }
  else {
    *(undefined4 *)(*in_FS_OFFSET + -0xf7c) = 0x17a;
    *(char **)(*in_FS_OFFSET + -0xe78) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Read.cpp"
    ;
    __return_storage_ptr__->_vptr_expected = (_func_int **)&PTR__expected_00199c10;
    (__return_storage_ptr__->field_1).Val = (chunk_exp_cache *)pcVar11;
    (__return_storage_ptr__->field_1).Err.StrGened = SUB41((uint)uVar19 >> 0x10,0);
    *(ushort *)((long)&__return_storage_ptr__->field_1 + 8) = (ushort)uVar19 | 0x100;
  }
  __return_storage_ptr__->Ok = false;
  return __return_storage_ptr__;
}

Assistant:

expected<const chunk_exp_cache*, idx2_err_code>
ReadChunkExponents(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
    auto ChunkExpCacheIt = Lookup(D->FileCache.ChunkExpCaches, ChunkAddress);
    if (ChunkExpCacheIt)
      return ChunkExpCacheIt.Val;

    //read the block
    // TOOD: who manages the memory for buff? (when do I deallocate it?)
    buffer buff;
    bool Result = Idx2.external_read(Idx2, buff, ChunkAddress).get();
    if (!Result)
      idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    //decompress the block
    chunk_exp_cache ChunkExpCache;
    bitstream& ChunkExpStream = ChunkExpCache.ChunkExpStream;
    DecompressBufZstd(buff, &ChunkExpStream);
    DeallocBuf(&buff);
    InitRead(&ChunkExpCache.ChunkExpStream, ChunkExpStream.Stream);
    Insert(&ChunkExpCacheIt, ChunkAddress, ChunkExpCache);
    return ChunkExpCacheIt.Val;
  }
#endif

  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  idx2_PropagateIfError(ReadFileExponents(Idx2, D, Level, &FileCacheIt, FileId));
  if (!FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkExpCaches)::iterator ChunkCacheIt;
  ChunkCacheIt = Lookup(FileCache->ChunkExpCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);

  chunk_exp_cache* ChunkExpCache = ChunkCacheIt.Val;
  if (Size(ChunkExpCache->ChunkExpStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkExpCache->ChunkPos;
    i64 ChunkExpOffset = FileCache->ExponentBeginOffset;
    i32 ChunkExpSize = FileCache->ChunkExpOffsets[ChunkPos];
    if (ChunkPos > 0)
    {
      i32 PrevChunkOffset = FileCache->ChunkExpOffsets[ChunkPos - 1];
      ChunkExpOffset += PrevChunkOffset;
      ChunkExpSize -= PrevChunkOffset;
    }
    idx2_FSeek(Fp, ChunkExpOffset, SEEK_SET);
    bitstream& ChunkExpStream = ChunkExpCache->ChunkExpStream;
    idx2_ScopeBuffer(CompressedChunkExpsBuf, ChunkExpSize);
    ReadBuffer(Fp, &CompressedChunkExpsBuf, ChunkExpSize);
    DecompressBufZstd(CompressedChunkExpsBuf, &ChunkExpStream);
    D->BytesDecoded_ += ChunkExpSize;
    D->BytesExps_ += ChunkExpSize;
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    InitRead(&ChunkExpStream, ChunkExpStream.Stream);
  }

  return ChunkCacheIt.Val;
}